

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<SynBinaryOpElement,_32U>::~SmallArray(SmallArray<SynBinaryOpElement,_32U> *this)

{
  SynBinaryOpElement *pSVar1;
  
  pSVar1 = this->data;
  if (pSVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pSVar1 != (SynBinaryOpElement *)0x0) {
        (*(code *)NULLC::dealloc)(pSVar1);
      }
    }
    else if (pSVar1 != (SynBinaryOpElement *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}